

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O2

void glcts::CullDistance::Utilities::replaceAll(string *str,string *from,string *to)

{
  ulong uVar1;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)str,(ulong)from);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)str,uVar1,(string *)from->_M_string_length);
  }
  return;
}

Assistant:

void CullDistance::Utilities::replaceAll(std::string& str, const std::string& from, const std::string& to)
{
	for (size_t start_pos = str.find(from, 0); start_pos != std::string::npos; start_pos = str.find(from, start_pos))
	{
		str.replace(start_pos, from.length(), to);

		start_pos += to.length();
	}

	return;
}